

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialBeamANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMaterialBeamANCF::ChMaterialBeamANCF
          (ChMaterialBeamANCF *this,double rho,double E,double nu,double k1,double k2)

{
  ChVector<double> *G;
  double dVar1;
  ChVector<double> local_60;
  ChVector<double> local_48;
  ChVector<double> local_30;
  
  this->m_rho = rho;
  G = &local_30;
  dVar1 = (E * 0.5) / (nu + 1.0);
  local_60.m_data[0] = nu;
  local_60.m_data[1] = nu;
  local_60.m_data[2] = nu;
  local_48.m_data[0] = E;
  local_48.m_data[1] = E;
  local_48.m_data[2] = E;
  local_30.m_data[0] = dVar1;
  local_30.m_data[1] = dVar1;
  local_30.m_data[2] = dVar1;
  Calc_D0_Dv(this,&local_48,&local_60,G,k1,k2);
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1d] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1e] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1f] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x20] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x21] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x22] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[4] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x10] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x11] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x12] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x13] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x14] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x16] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x17] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[8] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[10] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xb] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xc] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xd] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xf] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x18] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x19] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1a] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1b] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1d] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1e] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1f] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = E;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = E;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = E;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = 0.0;
  *(undefined1 (*) [16])
   ((this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array + 0x12) = ZEXT816(0) << 0x20;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = dVar1 * k1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = dVar1 * k2;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = dVar1;
  local_60.m_data[0] = nu;
  local_60.m_data[1] = nu;
  local_60.m_data[2] = nu;
  local_48.m_data[0] = E;
  local_48.m_data[1] = E;
  local_48.m_data[2] = E;
  Calc_E_eps_Nu(this,&local_48,&local_60,G);
  return;
}

Assistant:

ChMaterialBeamANCF::ChMaterialBeamANCF(double rho,  // material density
                                       double E,    // Young's modulus
                                       double nu,   // Poisson ratio
                                       double k1,   // Shear correction factor along beam local y axis
                                       double k2    // Shear correction factor along beam local z axis
                                       )
    : m_rho(rho) {
    double G = 0.5 * E / (1 + nu);
    Calc_D0_Dv(ChVector<>(E), ChVector<>(nu), ChVector<>(G), k1, k2);
    Calc_E_eps(ChVector<>(E), ChVector<>(nu), ChVector<>(G), k1, k2);  //(For compatibility with ChElementBeam only)
    Calc_E_eps_Nu(E, nu, G);                                           //(For compatibility with ChElementBeam only)
}